

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decNumber.cpp
# Opt level: O0

decNumber * uprv_decNumberAdd_63(decNumber *res,decNumber *lhs,decNumber *rhs,decContext *set)

{
  uint32_t local_2c;
  decContext *pdStack_28;
  uint32_t status;
  decContext *set_local;
  decNumber *rhs_local;
  decNumber *lhs_local;
  decNumber *res_local;
  
  local_2c = 0;
  pdStack_28 = set;
  set_local = (decContext *)rhs;
  rhs_local = lhs;
  lhs_local = res;
  decAddOp(res,lhs,rhs,set,'\0',&local_2c);
  if (local_2c != 0) {
    decStatus(lhs_local,local_2c,pdStack_28);
  }
  return lhs_local;
}

Assistant:

U_CAPI decNumber * U_EXPORT2 uprv_decNumberAdd(decNumber *res, const decNumber *lhs,
                         const decNumber *rhs, decContext *set) {
  uInt status=0;                        /* accumulator  */
  decAddOp(res, lhs, rhs, set, 0, &status);
  if (status!=0) decStatus(res, status, set);
  #if DECCHECK
  decCheckInexact(res, set);
  #endif
  return res;
  }